

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O1

uchar __thiscall Pl_LZWDecoder::getFirstChar(Pl_LZWDecoder *this,uint code)

{
  pointer pBVar1;
  byte *pbVar2;
  long *plVar3;
  runtime_error *prVar4;
  long *plVar5;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (0xff < code) {
    if (code < 0x102) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_60,code);
      std::operator+(&local_40,"Pl_LZWDecoder::getFirstChar called with invalid code (",&local_60);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
      local_80 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_80 == plVar5) {
        local_70 = *plVar5;
        lStack_68 = plVar3[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar5;
      }
      local_78 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::runtime_error::runtime_error(prVar4,(string *)&local_80);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pBVar1 = (this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) <=
        (ulong)(code - 0x102)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Pl_LZWDecoder::getFirstChar: table overflow");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pbVar2 = Buffer::getBuffer(pBVar1 + (code - 0x102));
    code = (uint)*pbVar2;
  }
  return (uchar)code;
}

Assistant:

unsigned char
Pl_LZWDecoder::getFirstChar(unsigned int code)
{
    unsigned char result = '\0';
    if (code < 256) {
        result = static_cast<unsigned char>(code);
    } else if (code > 257) {
        unsigned int idx = code - 258;
        if (idx >= table.size()) {
            throw std::runtime_error("Pl_LZWDecoder::getFirstChar: table overflow");
        }
        Buffer& b = table.at(idx);
        result = b.getBuffer()[0];
    } else {
        throw std::runtime_error(
            "Pl_LZWDecoder::getFirstChar called with invalid code (" + std::to_string(code) + ")");
    }
    return result;
}